

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall
soul::heart::ArrayElement::visitExpressions
          (ArrayElement *this,ExpressionVisitorFn fn,AccessType mode)

{
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> ref;
  pool_ptr<soul::heart::Expression> local_30;
  
  if ((this->dynamicIndex).object != (Expression *)0x0) {
    pEVar1 = pool_ptr<soul::heart::Expression>::operator->(&this->dynamicIndex);
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
    pool_ptr<soul::heart::Expression>::getAsPoolRef(&local_30);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,(pool_ref<soul::heart::Expression> *)&local_30,read);
    (this->dynamicIndex).object = local_30.object;
  }
  pEVar1 = (this->parent).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,(ulong)mode);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->parent,mode);
  if ((ArrayElement *)(this->parent).object != this) {
    return;
  }
  throwInternalCompilerError("parent != *this","visitExpressions",0x22f);
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn, AccessType mode) override
        {
            if (isDynamic())
            {
                dynamicIndex->visitExpressions (fn, AccessType::read);
                auto ref = dynamicIndex.getAsPoolRef();
                fn (ref, AccessType::read);
                dynamicIndex = ref;
            }

            parent->visitExpressions (fn, mode);
            fn (parent, mode);
            SOUL_ASSERT (parent != *this);
        }